

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O0

Params * adios2::helper::BuildParametersMap
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *parameters,char delimKeyValue)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  undefined8 in_RSI;
  key_type *in_RDI;
  string value;
  string field;
  string *parameter;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  anon_class_1_0_00000001 lf_GetFieldValue;
  anon_class_1_0_00000001 lf_Trim;
  Params *parametersOutput;
  mapped_type *in_stack_fffffffffffffd58;
  allocator *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  allocator *in_stack_fffffffffffffd70;
  key_type *__rhs;
  string *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  undefined1 local_1e9 [40];
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [7];
  char in_stack_fffffffffffffec7;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffee0;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_14;
  undefined8 local_10;
  
  local_14 = 0;
  __rhs = in_RDI;
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x9c282a);
  local_20 = local_10;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd58);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd60,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd58), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    std::__cxx11::string::string(local_58);
    std::__cxx11::string::string(local_78);
    std::__cxx11::string::string(local_98,(string *)local_38);
    BuildParametersMap::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec7);
    std::__cxx11::string::~string(local_98);
    BuildParametersMap::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    BuildParametersMap::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"Helper",&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"adiosString",&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_118,"BuildParametersMap",(allocator *)&stack0xfffffffffffffee7);
      std::operator+((char *)in_stack_fffffffffffffda8,__rhs);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      std::operator+(in_stack_fffffffffffffd68,(char)((ulong)in_stack_fffffffffffffd60 >> 0x38));
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      Throw<std::invalid_argument>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,(int)((ulong)__rhs >> 0x20));
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    if (sVar3 == 1) {
      in_stack_fffffffffffffd70 = &local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"Helper",in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1e9 + 1),"adiosString",(allocator *)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd60 = &local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"BuildParametersMap",in_stack_fffffffffffffd60);
      std::operator+((char *)in_stack_fffffffffffffda8,__rhs);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      Throw<std::invalid_argument>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8,(int)((ulong)__rhs >> 0x20));
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::__cxx11::string::~string((string *)(local_1e9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e9);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    in_stack_fffffffffffffd58 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)__rhs,in_RDI);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffd58,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  return (Params *)__rhs;
}

Assistant:

Params BuildParametersMap(const std::vector<std::string> &parameters, const char delimKeyValue)
{
    auto lf_Trim = [](std::string &input) {
        input.erase(0, input.find_first_not_of(" \n\r\t")); // prefixing spaces
        input.erase(input.find_last_not_of(" \n\r\t") + 1); // suffixing spaces
    };

    auto lf_GetFieldValue = [](const std::string parameter, std::string &field, std::string &value,
                               const char delimKeyValue) {
        auto equalPosition = parameter.find(delimKeyValue);

        if (equalPosition == parameter.npos)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "wrong format for IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value for each entry");
        }

        field = parameter.substr(0, equalPosition);
        value = parameter.substr(equalPosition + 1);
    };

    // BODY OF FUNCTION STARTS HERE
    Params parametersOutput;

    for (const std::string &parameter : parameters)
    {
        std::string field, value;
        lf_GetFieldValue(parameter, field, value, delimKeyValue);
        lf_Trim(field);
        lf_Trim(value);

        if (value.length() == 0)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "empty value in IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value");
        }
        if (parametersOutput.count(field) == 1)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "parameter " + field +
                                                     " already exists, must be unique");
        }

        parametersOutput[field] = value;
    }

    return parametersOutput;
}